

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ModSystem.cpp
# Opt level: O0

void __thiscall
AuthGameCommand::trigger
          (AuthGameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  PlayerInfo *pPVar1;
  PlayerInfo *pPVar2;
  bool bVar3;
  int iVar4;
  Config *pCVar5;
  string *this_00;
  undefined8 uVar6;
  __sv_type __y;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  size_t local_148;
  char *local_140;
  size_t local_138;
  char *local_130;
  size_t local_128;
  char *local_120;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  __sv_type local_e8;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  ModGroup *local_b8;
  ModGroup *defaultGroup;
  char *local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  __sv_type local_80;
  int local_6c;
  undefined1 auStack_68 [4];
  int cAccess;
  char *local_60;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  AuthGameCommand *local_48;
  size_t local_40;
  PlayerInfo *local_38;
  PlayerInfo *target;
  PlayerInfo *player_local;
  Server *source_local;
  AuthGameCommand *this_local;
  string_view parameters_local;
  
  parameters_local._M_len = (size_t)parameters._M_str;
  this_local = (AuthGameCommand *)parameters._M_len;
  target = player;
  player_local = (PlayerInfo *)source;
  source_local = (Server *)this;
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  pPVar2 = player_local;
  pPVar1 = target;
  if (bVar3) {
    bVar7 = sv("Error: Too few parameters. Syntax: auth <player>",0x30);
    local_148 = bVar7._M_len;
    local_140 = bVar7._M_str;
    RenX::Server::sendMessage(pPVar2,pPVar1,local_148,local_140);
  }
  else {
    local_48 = this_local;
    local_40 = parameters_local._M_len;
    local_38 = (PlayerInfo *)
               RenX::Server::getPlayerByPartName(player_local,this_local,parameters_local._M_len);
    pPVar2 = player_local;
    pPVar1 = target;
    if (local_38 == (PlayerInfo *)0x0) {
      local_58 = sv("Error: Player not found.",0x18);
      RenX::Server::sendMessage(pPVar2,pPVar1,local_58._M_len,local_58._M_str);
    }
    else if (local_38 == target) {
      _auStack_68 = sv("Error: You can not authenticate yourself.",0x29);
      RenX::Server::sendMessage(pPVar2,pPVar1,_auStack_68,local_60);
    }
    else {
      local_80 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_38->uuid)
      ;
      local_6c = RenX_ModSystemPlugin::getConfigAccess(&pluginInstance,local_80);
      pPVar2 = player_local;
      pPVar1 = target;
      if (target->access < local_6c) {
        local_90 = sv("Error: Can\'t authenticate higher level moderators.",0x32);
        RenX::Server::sendMessage(pPVar2,pPVar1,local_90._M_len,local_90._M_str);
      }
      else if (local_38->access == local_6c) {
        local_a0 = sv("Error: Player is already authenticated",0x26);
        RenX::Server::sendMessage(pPVar2,pPVar1,local_a0._M_len,local_a0._M_str);
      }
      else if (local_6c < local_38->access) {
        _defaultGroup = sv("Error: Player is already temporarily authenticated.",0x33);
        RenX::Server::sendMessage(pPVar2,pPVar1,defaultGroup,local_a8);
      }
      else {
        local_b8 = RenX_ModSystemPlugin::getDefaultGroup(&pluginInstance);
        iVar4 = RenX_ModSystemPlugin::auth
                          (&pluginInstance,(Server *)player_local,target,false,false);
        pPVar2 = player_local;
        pPVar1 = target;
        if (iVar4 == -1) {
          local_c8 = sv("Error: Player failed to pass strict lock checks. Player kicked.",0x3f);
          RenX::Server::sendMessage(pPVar2,pPVar1,local_c8._M_len,local_c8._M_str);
        }
        else {
          pCVar5 = &target->varData;
          this_00 = (string *)Jupiter::Plugin::getName_abi_cxx11_();
          local_e8 = std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
          uVar6 = Jupiter::Config::operator[](pCVar5,local_e8._M_len,local_e8._M_str);
          local_f8 = sv("Group",5);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_108);
          local_d8 = (basic_string_view<char,_std::char_traits<char>_>)
                     Jupiter::Config::get
                               (uVar6,local_f8._M_len,local_f8._M_str,local_108._M_len,
                                local_108._M_str);
          __y = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_b8->name);
          bVar3 = std::operator==(local_d8,__y);
          pPVar2 = player_local;
          pPVar1 = target;
          if (bVar3) {
            bVar7 = sv("Error: Failed to authenticate player.",0x25);
            local_128 = bVar7._M_len;
            local_120 = bVar7._M_str;
            RenX::Server::sendMessage(pPVar2,pPVar1,local_128,local_120);
          }
          else {
            bVar7 = sv("Player authenticated successfully.",0x22);
            local_138 = bVar7._M_len;
            local_130 = bVar7._M_str;
            RenX::Server::sendMessage(pPVar2,pPVar1,local_138,local_130);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void AuthGameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters)
{
	if (!parameters.empty())
	{
		RenX::PlayerInfo *target = source->getPlayerByPartName(parameters);
		if (target == nullptr)
			source->sendMessage(*player, "Error: Player not found."sv);
		else if (target == player)
			source->sendMessage(*player, "Error: You can not authenticate yourself."sv);
		else
		{
			int cAccess = pluginInstance.getConfigAccess(target->uuid);
			if (cAccess > player->access)
				source->sendMessage(*player, "Error: Can't authenticate higher level moderators."sv);
			else if (target->access == cAccess)
				source->sendMessage(*player, "Error: Player is already authenticated"sv);
			else if (target->access > cAccess)
				source->sendMessage(*player, "Error: Player is already temporarily authenticated."sv);
			else
			{
				RenX_ModSystemPlugin::ModGroup *defaultGroup = pluginInstance.getDefaultGroup();
				if (pluginInstance.auth(*source, *player) == -1)
					source->sendMessage(*player, "Error: Player failed to pass strict lock checks. Player kicked."sv);
				else if (defaultGroup->name == player->varData[pluginInstance.getName()].get("Group"sv))
					source->sendMessage(*player, "Error: Failed to authenticate player."sv);
				else
					source->sendMessage(*player, "Player authenticated successfully."sv);
			}
		}
	}
	else
		source->sendMessage(*player, "Error: Too few parameters. Syntax: auth <player>"sv);
}